

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackArchiveGenerator::GetArchiveComponentFileName
          (string *__return_storage_ptr__,cmCPackArchiveGenerator *this,string *component,
          bool isGroupName)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string componentUpper;
  allocator<char> local_aa;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  cmsys::SystemTools::UpperCase(&local_48,component);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_88,"CPACK_ARCHIVE_",&local_48);
  std::operator+(&local_a8,&local_88,"_FILE_NAME");
  bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  if (bVar1) {
    std::operator+(&local_88,"CPACK_ARCHIVE_",&local_48);
    std::operator+(&local_a8,&local_88,"_FILE_NAME");
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_a8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = &local_88;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"CPACK_ARCHIVE_FILE_NAME",(allocator<char> *)&local_88);
    bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"CPACK_ARCHIVE_FILE_NAME",&local_a9);
      pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_68);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar2,&local_aa);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (&local_a8,this,&local_88,component,(ulong)isGroupName);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"CPACK_PACKAGE_FILE_NAME",&local_a9);
      pcVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_68);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar2,&local_aa);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (&local_a8,this,&local_88,component,(ulong)isGroupName);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    this_00 = &local_68;
  }
  std::__cxx11::string::~string((string *)this_00);
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackArchiveGenerator::GetArchiveComponentFileName(
  const std::string& component, bool isGroupName)
{
  std::string componentUpper(cmSystemTools::UpperCase(component));
  std::string packageFileName;

  if (this->IsSet("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME")) {
    packageFileName +=
      this->GetOption("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME");
  } else if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    packageFileName += GetComponentPackageFileName(
      this->GetOption("CPACK_ARCHIVE_FILE_NAME"), component, isGroupName);
  } else {
    packageFileName += GetComponentPackageFileName(
      this->GetOption("CPACK_PACKAGE_FILE_NAME"), component, isGroupName);
  }

  packageFileName += this->GetOutputExtension();

  return packageFileName;
}